

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

MD5 * __thiscall MD5::finalize(MD5 *this)

{
  uint uVar1;
  uint uVar2;
  MD5 *in_RDI;
  size_type padLen;
  size_type index;
  uchar bits [8];
  int local_24;
  size_type length;
  MD5 *in_stack_fffffffffffffff0;
  
  if ((in_RDI->finalized & 1U) == 0) {
    encode(&stack0xfffffffffffffff0,in_RDI->count,8);
    uVar1 = in_RDI->count[0] >> 3;
    uVar2 = uVar1 & 0x3f;
    if (uVar2 < 0x38) {
      local_24 = 0x38 - uVar2;
    }
    else {
      local_24 = 0x78 - uVar2;
    }
    length = (size_type)((ulong)in_RDI >> 0x20);
    update(in_stack_fffffffffffffff0,(uchar *)(CONCAT44(uVar1,local_24) & 0x3fffffffff),length);
    update(in_stack_fffffffffffffff0,(uchar *)CONCAT44(uVar2,local_24),length);
    encode(in_RDI->digest,in_RDI->state,0x10);
    memset(in_RDI->buffer,0,0x40);
    memset(in_RDI->count,0,8);
    in_RDI->finalized = true;
  }
  return in_RDI;
}

Assistant:

MD5& MD5::finalize()
{
  static unsigned char padding[64] = {
    0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
  };
 
  if (!finalized) {
    // Save number of bits
    unsigned char bits[8];
    encode(bits, count, 8);
 
    // pad out to 56 mod 64.
    size_type index = count[0] / 8 % 64;
    size_type padLen = (index < 56) ? (56 - index) : (120 - index);
    update(padding, padLen);
 
    // Append length (before padding)
    update(bits, 8);
 
    // Store state in digest
    encode(digest, state, 16);
 
    // Zeroize sensitive information.
    memset(buffer, 0, sizeof buffer);
    memset(count, 0, sizeof count);
 
    finalized=true;
  }
 
  return *this;
}